

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.cc
# Opt level: O0

void __thiscall trng::yarn2::yarn2(yarn2 *this,unsigned_long s,parameter_type P)

{
  undefined8 in_RDX;
  unsigned_long in_RSI;
  yarn2 *in_RDI;
  
  *(undefined8 *)(in_RDI->P).a = in_RDX;
  mrg_status<int,_2,_trng::yarn2>::mrg_status(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

yarn2::yarn2(unsigned long s, yarn2::parameter_type P) : P{P} { seed(s); }